

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testNetworkAdapterList(void)

{
  uint family_00;
  size_t sVar1;
  void *pvVar2;
  C *pCVar3;
  char *pcVar4;
  NetworkAdapterAddress *pNVar5;
  SockAddr netMask;
  uint_t family;
  NetworkAdapterAddress *address;
  size_t i;
  ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>
  addressIt;
  ConstList<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>
  addressList;
  NetworkAdapterDesc *adapter;
  Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>
  adapterIt;
  List<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
  adapterList;
  SockAddr *in_stack_fffffffffffffe58;
  IteratorBase<axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::io::NetworkAdapterDesc,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>
  in_stack_fffffffffffffe60;
  IteratorBase<axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_const_axl::io::NetworkAdapterAddress,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>
  in_stack_fffffffffffffe68;
  C *in_stack_fffffffffffffe70;
  uchar_t *in_stack_fffffffffffffe78;
  NetworkAdapterAddress *in_stack_fffffffffffffe88;
  IteratorImpl<axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_const_axl::io::NetworkAdapterAddress,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>
  local_88 [10];
  NetworkAdapterDesc *local_38;
  IteratorImpl<axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::io::NetworkAdapterDesc,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>
  local_30 [3];
  ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
  local_18;
  
  printf("Enumerating adapters...\n");
  axl::sl::
  List<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
  ::List((List<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
          *)0x10d68a);
  axl::io::enumerateNetworkAdapters
            ((List<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
              *)0x10d697);
  sVar1 = axl::sl::
          ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
          ::getCount(&local_18);
  printf("%d adapters found.\n",sVar1);
  local_30[0].
  super_IteratorBase<axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::io::NetworkAdapterDesc,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>
  .m_p = (IteratorBase<axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::io::NetworkAdapterDesc,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>
          )axl::sl::
           ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
           ::getHead((ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
                      *)in_stack_fffffffffffffe58);
  while( true ) {
    pvVar2 = axl::sl::IteratorBase::operator_cast_to_void_((IteratorBase *)local_30);
    if (pvVar2 == (void *)0x0) break;
    local_38 = axl::sl::
               IteratorImpl<axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::io::NetworkAdapterDesc,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>
               ::operator*(local_30);
    pCVar3 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                       ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                        in_stack_fffffffffffffe60.m_p);
    printf("Name        = %s\n",pCVar3);
    pCVar3 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                       ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                        in_stack_fffffffffffffe60.m_p);
    printf("Description = %s\n",pCVar3);
    pcVar4 = axl::io::getNetworkAdapterTypeString(local_38->m_type);
    printf("Type        = %s\n",pcVar4);
    axl::io::getNetworkAdapterFlagString((uint_t)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    pCVar3 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                       ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                        in_stack_fffffffffffffe60.m_p);
    printf("Flags       = %s\n",pCVar3);
    axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10d809);
    axl::io::getMacAddressString
              (in_stack_fffffffffffffe78,(uint_t)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    pCVar3 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                       ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                        in_stack_fffffffffffffe60.m_p);
    printf("Mac         = %s\n",pCVar3);
    axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10d85c);
    axl::sl::
    ConstList<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>
    ::ConstList((ConstList<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>
                 *)in_stack_fffffffffffffe60.m_p,
                (ListBase<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>_>
                 *)in_stack_fffffffffffffe58);
    local_88[0].
    super_IteratorBase<axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_const_axl::io::NetworkAdapterAddress,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>
    .m_p = (IteratorBase<axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_const_axl::io::NetworkAdapterAddress,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>
            )axl::sl::
             ConstListBase<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>,_axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>_>
             ::getHead((ConstListBase<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>,_axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>_>
                        *)in_stack_fffffffffffffe68.m_p);
    while( true ) {
      pvVar2 = axl::sl::IteratorBase::operator_cast_to_void_((IteratorBase *)local_88);
      if (pvVar2 == (void *)0x0) break;
      pNVar5 = axl::sl::
               IteratorImpl<axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_const_axl::io::NetworkAdapterAddress,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>
               ::operator*(local_88);
      family_00 = (uint)(pNVar5->m_address).field_0.m_addr.sa_family;
      in_stack_fffffffffffffe88 = pNVar5;
      pcVar4 = axl::io::getSockAddrFamilyString(family_00);
      axl::io::SockAddr::getString(in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe78 =
           (uchar_t *)
           axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                     ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                      in_stack_fffffffffffffe60.m_p);
      printf("%-11s = %s",pcVar4,in_stack_fffffffffffffe78);
      axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10d964);
      if (family_00 == 2) {
        axl::io::SockAddr::SockAddr((SockAddr *)0x10d97f);
        axl::io::SockAddr::createNetMask_ip4
                  ((SockAddr *)in_stack_fffffffffffffe60.m_p,(size_t)in_stack_fffffffffffffe58);
        axl::io::SockAddr::getString(in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe70 =
             axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                       ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                        in_stack_fffffffffffffe60.m_p);
        printf(" (mask %s)\n",in_stack_fffffffffffffe70);
        axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                  ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10d9e9);
      }
      else {
        printf("/%d\n",pNVar5->m_netMaskBitCount);
      }
      in_stack_fffffffffffffe68.m_p =
           (Entry *)axl::sl::
                    IteratorBase<axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_const_axl::io::NetworkAdapterAddress,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>
                    ::operator++((IteratorBase<axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_const_axl::io::NetworkAdapterAddress,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>
                                  *)in_stack_fffffffffffffe58,0);
    }
    printf("\n");
    in_stack_fffffffffffffe60.m_p =
         (Entry *)axl::sl::
                  IteratorBase<axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::io::NetworkAdapterDesc,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>
                  ::operator++((IteratorBase<axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::io::NetworkAdapterDesc,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>
                                *)in_stack_fffffffffffffe58,0);
  }
  sVar1 = axl::sl::
          ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
          ::getCount(&local_18);
  printf("%d adapters found\n",sVar1);
  axl::sl::
  List<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
  ::~List((List<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
           *)0x10db69);
  return;
}

Assistant:

void
testNetworkAdapterList() {
	printf("Enumerating adapters...\n");

	sl::List<io::NetworkAdapterDesc> adapterList;
	io::enumerateNetworkAdapters(&adapterList);

	printf("%d adapters found.\n", adapterList.getCount());

	sl::Iterator<io::NetworkAdapterDesc> adapterIt = adapterList.getHead();
	for (; adapterIt; adapterIt++) {
		io::NetworkAdapterDesc* adapter = *adapterIt;

		printf("Name        = %s\n", adapter->m_name.sz());
		printf("Description = %s\n", adapter->m_description.sz());
		printf("Type        = %s\n", io::getNetworkAdapterTypeString(adapter->m_type));
		printf("Flags       = %s\n", io::getNetworkAdapterFlagString(adapter->m_flags).sz());
		printf("Mac         = %s\n", io::getMacAddressString(adapter->m_macAddress).sz());

		sl::ConstList<io::NetworkAdapterAddress> addressList = adapter->m_addressList;
		sl::ConstIterator<io::NetworkAdapterAddress> addressIt = addressList.getHead();
		for (size_t i = 1; addressIt; addressIt++, i++) {
			const io::NetworkAdapterAddress* address = *addressIt;

			uint_t family = address->m_address.m_addr.sa_family;
			printf("%-11s = %s",
				io::getSockAddrFamilyString(family),
				address->m_address.getString().sz()
			);

			if (family == AF_INET) {
				io::SockAddr netMask;
				netMask.createNetMask_ip4(address->m_netMaskBitCount);
				printf(" (mask %s)\n", netMask.getString().sz());
			} else {
				printf("/%d\n", address->m_netMaskBitCount);
			}
		}

		printf("\n");
	}

	printf("%d adapters found\n", adapterList.getCount());
}